

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  JavascriptGeneratorFunction *this;
  SnapGeneratorFunctionInfo *pSVar1;
  GeneratorVirtualScriptFunction *scriptFunction;
  GeneratorVirtualScriptFunction *gvsf;
  SnapGeneratorFunctionInfo *info;
  JavascriptAsyncFunction *func;
  InflateMap *inflator_local;
  RecyclableObject *obj_local;
  SnapObject *snpObject_local;
  
  this = &Js::VarTo<Js::JavascriptAsyncFunction,Js::RecyclableObject>(obj)->
          super_JavascriptGeneratorFunction;
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)36>
                     (snpObject);
  if (pSVar1->scriptFunction != 0) {
    scriptFunction =
         (GeneratorVirtualScriptFunction *)InflateMap::LookupObject(inflator,pSVar1->scriptFunction)
    ;
    Js::JavascriptGeneratorFunction::SetScriptFunction(this,scriptFunction);
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapAsyncFunction(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::JavascriptAsyncFunction* func = Js::VarTo<Js::JavascriptAsyncFunction>(obj);
            SnapGeneratorFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapGeneratorFunctionInfo *, SnapObjectType::SnapAsyncFunction>(snpObject);

            if (info->scriptFunction != TTD_INVALID_PTR_ID)
            {
                Js::GeneratorVirtualScriptFunction* gvsf = reinterpret_cast<Js::GeneratorVirtualScriptFunction*>(inflator->LookupObject(info->scriptFunction));
                func->SetScriptFunction(gvsf);
            }
        }